

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::createAndUploadTexture
          (TextureGather2DCase *this)

{
  Texture2D *this_00;
  ostringstream *this_01;
  RenderContext *context;
  TestLog *pTVar1;
  PtrData<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> data;
  TextureGather2DCase *pTVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  Texture2D *pTVar5;
  long lVar6;
  ConstPixelBufferAccess *__n;
  void *__buf;
  int levelNdx;
  long lVar7;
  long lVar8;
  ConstPixelBufferAccess *access;
  long lVar9;
  Texture2D *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  Texture2D *pTVar10;
  int local_334;
  TextureGather2DCase *local_330;
  Texture2D *local_328;
  ulong local_320;
  long local_318;
  MovePtr<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *local_310;
  Vector<int,_2> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  string local_2c0;
  string local_2a0;
  TextureFormatInfo texFmtInfo;
  MessageBuilder local_240;
  LogImage local_c0;
  
  context = ((this->super_TextureGatherCase).super_TestCase.m_context)->m_renderCtx;
  iVar3 = (*context->_vptr_RenderContext[3])(context);
  tcu::getTextureFormatInfo(&texFmtInfo,&(this->super_TextureGatherCase).m_textureFormat);
  pTVar5 = (Texture2D *)operator_new(0x70);
  dVar4 = glu::getInternalFormat((this->super_TextureGatherCase).m_textureFormat);
  glu::Texture2D::Texture2D
            (pTVar5,context,dVar4,(this->m_textureSize).m_data[0],(this->m_textureSize).m_data[1]);
  local_240.m_log = (TestLog *)0x0;
  local_310 = &this->m_texture;
  data._8_8_ = in_stack_fffffffffffffcc0;
  data.ptr = in_stack_fffffffffffffcb8;
  de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::assignData
            (&local_310->super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>,data)
  ;
  de::details::UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>::~UniqueBase
            ((UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_> *)&local_240);
  pTVar5 = (this->m_texture).super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>.
           m_data.ptr;
  local_334 = (this->super_TextureGatherCase).m_baseLevel;
  if (((this->super_TextureGatherCase).m_minFilter - NEAREST_MIPMAP_NEAREST < 4) &&
     (((this->super_TextureGatherCase).m_flags & 1) == 0)) {
    local_320 = ((long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  }
  else {
    local_320 = (ulong)(local_334 + 1);
  }
  local_328 = &pTVar5->m_refTexture;
  local_330 = this;
  local_318 = CONCAT44(extraout_var,iVar3);
  for (; pTVar2 = local_330, local_334 < (int)local_320; local_334 = local_334 + 1) {
    tcu::Texture2D::allocLevel(local_328,local_334);
    pTVar2 = local_330;
    access = (ConstPixelBufferAccess *)
             ((long)local_334 * 0x28 +
             (long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_access.
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    dVar4 = tcu::CommandLine::getBaseSeed
                      (((local_330->super_TextureGatherCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_cmdLine);
    fillWithRandomColorTiles
              ((PixelBufferAccess *)access,&texFmtInfo.valueMin,&texFmtInfo.valueMax,dVar4);
    pTVar1 = ((pTVar2->super_TextureGatherCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx)->m_log;
    de::toString<int>(&local_2c0,&local_334);
    std::operator+(&local_300,"InputTextureLevel",&local_2c0);
    de::toString<int>(&local_2a0,&local_334);
    std::operator+(&local_2e0,"Input texture, level ",&local_2a0);
    __n = access;
    tcu::LogImage::LogImage(&local_c0,&local_300,&local_2e0,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,(int)pTVar1,__buf,(size_t)__n);
    this_01 = &local_240.m_str;
    local_240.m_log = pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::operator<<((ostream *)this_01,"Note: texture level\'s size is ");
    local_308.m_data = *(int (*) [2])(access->m_size).m_data;
    tcu::operator<<((ostream *)this_01,&local_308);
    tcu::MessageBuilder::operator<<(&local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
    tcu::LogImage::~LogImage(&local_c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  this_00 = &local_330->m_swizzledTexture;
  tcu::Texture2D::Texture2D
            ((Texture2D *)&local_240,(TextureFormat *)local_328,(pTVar5->m_refTexture).m_width,
             (pTVar5->m_refTexture).m_height);
  tcu::Texture2D::operator=(this_00,(Texture2D *)&local_240);
  tcu::Texture3D::~Texture3D((Texture3D *)&local_240);
  lVar8 = 8;
  lVar9 = 0;
  lVar7 = 0;
  pTVar10 = pTVar5;
  while( true ) {
    lVar6 = (long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_access.
                  super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(lVar6 / 0x28) <= lVar7) break;
    if (*(long *)((long)(pTVar5->m_refTexture).super_TextureLevelPyramid.m_data.
                        super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar8) != 0) {
      tcu::Texture2D::allocLevel(this_00,(int)lVar7);
      pTVar5 = pTVar10;
      swizzlePixels((PixelBufferAccess *)
                    ((long)(((local_330->m_swizzledTexture).super_TextureLevelPyramid.m_access.
                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_ConstPixelBufferAccess).m_size.m_data + lVar9 + -8),
                    (ConstPixelBufferAccess *)
                    ((long)(pTVar10->m_refTexture).super_TextureLevelPyramid.m_access.
                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar9),
                    &(pTVar2->super_TextureGatherCase).m_textureSwizzle);
      pTVar10 = pTVar5;
    }
    lVar7 = lVar7 + 1;
    lVar9 = lVar9 + 0x28;
    lVar8 = lVar8 + 0x10;
  }
  (**(code **)(local_318 + 8))(0x84c0,pTVar5,lVar6 % 0x28);
  (*((local_310->super_UniqueBase<glu::Texture2D,_de::DefaultDeleter<glu::Texture2D>_>).m_data.ptr)
    ->_vptr_Texture2D[2])();
  return;
}

Assistant:

void TextureGather2DCase::createAndUploadTexture (void)
{
	const glu::RenderContext&		renderCtx	= m_context.getRenderContext();
	const glw::Functions&			gl			= renderCtx.getFunctions();
	const tcu::TextureFormatInfo	texFmtInfo	= tcu::getTextureFormatInfo(m_textureFormat);

	m_texture = MovePtr<glu::Texture2D>(new glu::Texture2D(renderCtx, glu::getInternalFormat(m_textureFormat), m_textureSize.x(), m_textureSize.y()));

	{
		tcu::Texture2D&		refTexture	= m_texture->getRefTexture();
		const int			levelBegin	= m_baseLevel;
		const int			levelEnd	= isMipmapFilter(m_minFilter) && !(m_flags & GATHERCASE_MIPMAP_INCOMPLETE) ? refTexture.getNumLevels() : m_baseLevel+1;
		DE_ASSERT(m_baseLevel < refTexture.getNumLevels());

		for (int levelNdx = levelBegin; levelNdx < levelEnd; levelNdx++)
		{
			refTexture.allocLevel(levelNdx);
			const PixelBufferAccess& level = refTexture.getLevel(levelNdx);
			fillWithRandomColorTiles(level, texFmtInfo.valueMin, texFmtInfo.valueMax, (deUint32)m_testCtx.getCommandLine().getBaseSeed());
			m_testCtx.getLog() << TestLog::Image("InputTextureLevel" + de::toString(levelNdx), "Input texture, level " + de::toString(levelNdx), level)
							   << TestLog::Message << "Note: texture level's size is " << IVec2(level.getWidth(), level.getHeight()) << TestLog::EndMessage;
		}

		swizzleTexture(m_swizzledTexture, refTexture, m_textureSwizzle);
	}

	gl.activeTexture(GL_TEXTURE0);
	m_texture->upload();
}